

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_ild.c
# Opt level: O1

int imm_dec(pt_ild *ild,uint8_t length)

{
  ushort uVar1;
  uint8_t *puVar2;
  bool bVar3;
  uint8_t uVar4;
  uint uVar5;
  pt_exec_mode pVar6;
  undefined3 *puVar7;
  int iVar8;
  byte bVar9;
  
  bVar9 = ild->map;
  uVar5 = 0xfffffff2;
  bVar3 = true;
  if (7 < bVar9) goto LAB_0010aa19;
  puVar2 = imm_bytes_desc[ild->vex][bVar9].table;
  if (puVar2 == (uint8_t *)0x0) {
    uVar4 = imm_bytes_desc[ild->vex][bVar9].width;
    if (uVar4 == 0xff) goto LAB_0010aa19;
    ild->imm1_bytes = uVar4;
    goto switchD_0010a810_default;
  }
  switch(puVar2[ild->nominal_opcode]) {
  case '\x01':
  case '\x02':
    goto switchD_0010a810_caseD_1;
  case '\x03':
    uVar5 = (uint)*(ushort *)&ild->field_0x10;
    if (ild->mode != ptem_32bit) {
      if (ild->mode != ptem_64bit) {
LAB_0010a9de:
        iVar8 = (uVar5 & 1) + 1;
        goto LAB_0010a9e7;
      }
      iVar8 = 3;
      if ((*(ushort *)&ild->field_0x10 >> 9 & 1) != 0) goto LAB_0010a9e7;
    }
LAB_0010a9d1:
    iVar8 = 2 - (uVar5 & 1);
    goto LAB_0010a9e7;
  case '\x04':
    uVar1 = *(ushort *)&ild->field_0x10;
    if (ild->mode == ptem_32bit) {
LAB_0010a8da:
      iVar8 = 2 - (uVar1 & 1);
    }
    else if (ild->mode == ptem_64bit) {
      iVar8 = 3;
      if ((uVar1 >> 9 & 1) == 0) goto LAB_0010a8da;
    }
    else {
      iVar8 = (uVar1 & 1) + 1;
    }
    puVar7 = &resolve_v_bytes;
    goto LAB_0010aa0e;
  case '\x05':
    ild->imm1_bytes = '\x02';
    break;
  case '\x06':
    bVar3 = false;
    uVar5 = 0;
    if (bVar9 != 0) goto LAB_0010aa19;
    bVar9 = ild->modrm_byte & 0x30;
    goto joined_r0x0010a85e;
  case '\a':
    bVar3 = false;
    uVar5 = 0;
    if (bVar9 != 0) goto LAB_0010aa19;
    bVar9 = ild->modrm_byte & 0x38;
    goto joined_r0x0010a85e;
  case '\b':
    uVar1 = *(ushort *)&ild->field_0x10;
    uVar5 = (uint)uVar1;
    if (ild->mode == ptem_32bit) goto LAB_0010a9d1;
    if (ild->mode != ptem_64bit) goto LAB_0010a9de;
    iVar8 = 3;
    if ((uVar1 >> 9 & 1) == 0) {
      iVar8 = (uint)((uVar1 & 1) == 0) * 2 + 1;
    }
LAB_0010a9e7:
    puVar7 = &resolve_z_bytes;
LAB_0010aa0e:
    uVar4 = *(uint8_t *)((ulong)(iVar8 - 1) + (long)puVar7);
    goto LAB_0010aa11;
  case '\t':
    bVar3 = false;
    uVar5 = 0;
    if (bVar9 != 0) goto LAB_0010aa19;
    bVar9 = ild->modrm_byte;
    goto joined_r0x0010a840;
  case '\n':
    bVar3 = false;
    uVar5 = 0;
    if (bVar9 != 0) goto LAB_0010aa19;
    ild->imm1_bytes = '\x02';
    ild->imm2_bytes = '\x01';
    break;
  case '\v':
    bVar3 = false;
    uVar5 = 0;
    if (bVar9 != 1) goto LAB_0010aa19;
    bVar3 = false;
    uVar5 = 0;
    if ((*(ushort *)&ild->field_0x10 & 1) == 0 && (*(ushort *)&ild->field_0x10 & 0x60) != 0x40)
    goto LAB_0010aa19;
    ild->imm1_bytes = '\x01';
    ild->imm2_bytes = '\x01';
    break;
  case '\f':
    bVar9 = ild->modrm_byte;
joined_r0x0010a840:
    bVar3 = false;
    uVar5 = 0;
    if ((bVar9 & 0x30) != 0) goto LAB_0010aa19;
switchD_0010a810_caseD_1:
    ild->imm1_bytes = '\x01';
    break;
  case '\r':
    bVar9 = ild->modrm_byte & 0x30;
joined_r0x0010a85e:
    bVar3 = false;
    uVar5 = 0;
    if (bVar9 != 0) goto LAB_0010aa19;
    pVar6 = pti_get_nominal_eosz(ild);
    uVar4 = *(uint8_t *)((long)&resolve_z_bytes + (ulong)(pVar6 - ptem_16bit));
LAB_0010aa11:
    ild->imm1_bytes = uVar4;
  }
switchD_0010a810_default:
  bVar3 = false;
  uVar5 = 0;
LAB_0010aa19:
  if (!bVar3) {
    bVar9 = length + ild->imm1_bytes + ild->imm2_bytes;
    uVar5 = 0xfffffff2;
    if (bVar9 <= ild->max_bytes) {
      uVar5 = (uint)bVar9;
    }
  }
  return uVar5;
}

Assistant:

static int imm_dec(struct pt_ild *ild, uint8_t length)
{
	int errcode;

	if (!ild)
		return -pte_internal;

	errcode = set_imm_bytes(ild);
	if (errcode < 0)
		return errcode;

	length += ild->imm1_bytes;
	length += ild->imm2_bytes;
	if (ild->max_bytes < length)
		return -pte_bad_insn;

	return length;
}